

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::monotonic_buffer_resource::monotonic_buffer_resource
          (monotonic_buffer_resource *this,memory_resource *upstream)

{
  _func_int **in_RSI;
  memory_resource *in_RDI;
  
  memory_resource::memory_resource(in_RDI);
  in_RDI->_vptr_memory_resource = (_func_int **)&PTR__monotonic_buffer_resource_0350c480;
  in_RDI[1]._vptr_memory_resource = in_RSI;
  in_RDI[2]._vptr_memory_resource = (_func_int **)0x40000;
  MemoryBlock::MemoryBlock((MemoryBlock *)(in_RDI + 3));
  in_RDI[5]._vptr_memory_resource = (_func_int **)0x0;
  std::__cxx11::
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::list((list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
          *)0x45998d);
  std::__cxx11::
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::list((list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
          *)0x45999a);
  return;
}

Assistant:

explicit monotonic_buffer_resource(memory_resource *upstream)
        : upstreamResource(upstream) {}